

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_data.c
# Opt level: O0

void ares_free_data(void *dataptr)

{
  undefined4 *ptr_00;
  ares_data *local_20;
  void *next_data;
  ares_data *ptr;
  void *dataptr_local;
  
  ptr = (ares_data *)dataptr;
  while (ptr != (ares_data *)0x0) {
    local_20 = (ares_data *)0x0;
    ptr_00 = (undefined4 *)((long)&ptr[-1].data + 0x28);
    if (*(int *)((long)&ptr[-1].data + 0x2c) != 0xbead) {
      return;
    }
    switch(*ptr_00) {
    case 2:
      local_20 = *(ares_data **)ptr;
      ares_free((ptr->data).txt_reply.next);
      break;
    case 3:
    case 4:
      local_20 = *(ares_data **)ptr;
      ares_free((ptr->data).txt_reply.next);
      break;
    case 5:
      local_20 = *(ares_data **)ptr;
      break;
    case 6:
      local_20 = *(ares_data **)ptr;
      ares_free((ptr->data).txt_reply.next);
      break;
    case 7:
      local_20 = *(ares_data **)ptr;
      ares_free((ptr->data).txt_reply.next);
      ares_free((ptr->data).txt_reply.txt);
      ares_free((ptr->data).naptr_reply.service);
      ares_free((ptr->data).naptr_reply.regexp);
      break;
    case 8:
      ares_free(*(void **)ptr);
      ares_free((ptr->data).txt_reply.next);
      break;
    case 9:
      local_20 = *(ares_data **)ptr;
      ares_free((ptr->data).txt_reply.txt);
      break;
    case 10:
      local_20 = *(ares_data **)ptr;
      break;
    case 0xb:
      local_20 = *(ares_data **)ptr;
      ares_free((ptr->data).txt_reply.txt);
      ares_free((ptr->data).naptr_reply.regexp);
      break;
    default:
      goto switchD_00110507_default;
    }
    ares_free(ptr_00);
    ptr = local_20;
  }
switchD_00110507_default:
  return;
}

Assistant:

void ares_free_data(void *dataptr)
{
  while (dataptr != NULL) {
    struct ares_data *ptr;
    void             *next_data = NULL;

#ifdef __INTEL_COMPILER
#  pragma warning(push)
#  pragma warning(disable : 1684)
    /* 1684: conversion from pointer to same-sized integral type */
#endif

    ptr = (void *)((char *)dataptr - offsetof(struct ares_data, data));

#ifdef __INTEL_COMPILER
#  pragma warning(pop)
#endif

    if (ptr->mark != ARES_DATATYPE_MARK) {
      return;
    }

    switch (ptr->type) {
      case ARES_DATATYPE_MX_REPLY:
        next_data = ptr->data.mx_reply.next;
        ares_free(ptr->data.mx_reply.host);
        break;

      case ARES_DATATYPE_SRV_REPLY:
        next_data = ptr->data.srv_reply.next;
        ares_free(ptr->data.srv_reply.host);
        break;

      case ARES_DATATYPE_URI_REPLY:
        next_data = ptr->data.uri_reply.next;
        ares_free(ptr->data.uri_reply.uri);
        break;

      case ARES_DATATYPE_TXT_REPLY:
      case ARES_DATATYPE_TXT_EXT:
        next_data = ptr->data.txt_reply.next;
        ares_free(ptr->data.txt_reply.txt);
        break;

      case ARES_DATATYPE_ADDR_NODE:
        next_data = ptr->data.addr_node.next;
        break;

      case ARES_DATATYPE_ADDR_PORT_NODE:
        next_data = ptr->data.addr_port_node.next;
        break;

      case ARES_DATATYPE_NAPTR_REPLY:
        next_data = ptr->data.naptr_reply.next;
        ares_free(ptr->data.naptr_reply.flags);
        ares_free(ptr->data.naptr_reply.service);
        ares_free(ptr->data.naptr_reply.regexp);
        ares_free(ptr->data.naptr_reply.replacement);
        break;

      case ARES_DATATYPE_SOA_REPLY:
        ares_free(ptr->data.soa_reply.nsname);
        ares_free(ptr->data.soa_reply.hostmaster);
        break;

      case ARES_DATATYPE_CAA_REPLY:
        next_data = ptr->data.caa_reply.next;
        ares_free(ptr->data.caa_reply.property);
        ares_free(ptr->data.caa_reply.value);
        break;

      default:
        return;
    }

    ares_free(ptr);
    dataptr = next_data;
  }
}